

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLoggerMgr::flushRawStack(SimpleLoggerMgr *this,RawStackInfo *stack_info)

{
  ofstream *poVar1;
  ofstream *poVar2;
  long lVar3;
  pointer ppvVar4;
  long lVar5;
  char cVar6;
  ostream *poVar7;
  pointer ppvVar8;
  
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 != '\0') {
    poVar1 = &this->crashDumpFile;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Thread ",7);
    lVar3 = *(long *)poVar1;
    *(uint *)(&this->field_0x240 + *(long *)(lVar3 + -0x18)) =
         *(uint *)(&this->field_0x240 + *(long *)(lVar3 + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)(&this->field_0x238 + *(long *)(lVar3 + -0x18)) = 4;
    poVar2 = poVar1 + *(long *)(lVar3 + -0x18);
    if ((&this->field_0x309)[*(long *)(lVar3 + -0x18)] == '\0') {
      std::ios::widen((char)poVar2);
      poVar2[0xe1] = (ofstream)0x1;
    }
    poVar2[0xe0] = (ofstream)0x30;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    cVar6 = (char)poVar1;
    if (stack_info->crashOrigin == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(crashed here)",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    ppvVar4 = (stack_info->stackPtrs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppvVar8 = (stack_info->stackPtrs).super__Vector_base<void_*,_std::allocator<void_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppvVar8 != ppvVar4;
        ppvVar8 = ppvVar8 + 1) {
      lVar3 = *(long *)(*(long *)&this->crashDumpFile + -0x18);
      *(uint *)(&this->field_0x240 + lVar3) = *(uint *)(&this->field_0x240 + lVar3) & 0xffffffb5 | 8
      ;
      poVar7 = std::ostream::_M_insert<void_const*>(poVar1);
      lVar3 = *(long *)poVar7;
      lVar5 = *(long *)(lVar3 + -0x18);
      *(uint *)(poVar7 + lVar5 + 0x18) = *(uint *)(poVar7 + lVar5 + 0x18) & 0xffffffb5 | 2;
      std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void SimpleLoggerMgr::flushRawStack(RawStackInfo& stack_info) {
    if (!crashDumpFile.is_open()) return;

    crashDumpFile << "Thread " << std::hex << std::setw(4) << std::setfill('0')
                  << stack_info.tidHash << std::dec
                  << " " << stack_info.kernelTid << std::endl;
    if (stack_info.crashOrigin) {
        crashDumpFile << "(crashed here)" << std::endl;
    }
    for (void* stack_ptr: stack_info.stackPtrs) {
        crashDumpFile << std::hex << stack_ptr << std::dec << std::endl;
    }
    crashDumpFile << std::endl;
}